

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

int vrf_line(order_t *o,int mode)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  
  if (0 < o->lines) {
    pcVar4 = o->lineorders[0].orderdate + 1;
    pcVar6 = o->lineorders[0].opriority + 1;
    pcVar7 = o->lineorders[0].commit_date + 1;
    pcVar5 = o->lineorders[0].shipmode + 1;
    lVar8 = 0;
    do {
      lVar3 = (long)o->lineorders[lVar8].linenumber + tdefs[5].vtotal + o->lineorders[lVar8].okey +
              o->lineorders[lVar8].custkey + o->lineorders[lVar8].partkey +
              o->lineorders[lVar8].suppkey;
      cVar1 = o->lineorders[lVar8].orderdate[0];
      pcVar2 = pcVar4;
      while (cVar1 != '\0') {
        lVar3 = lVar3 + cVar1;
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      }
      cVar1 = o->lineorders[lVar8].opriority[0];
      pcVar2 = pcVar6;
      while (cVar1 != '\0') {
        lVar3 = lVar3 + cVar1;
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      }
      tdefs[5].vtotal =
           lVar3 + o->lineorders[lVar8].ship_priority + o->lineorders[lVar8].quantity +
           o->lineorders[lVar8].extended_price + o->lineorders[lVar8].order_totalprice +
           o->lineorders[lVar8].discount + o->lineorders[lVar8].revenue +
           o->lineorders[lVar8].supp_cost + o->lineorders[lVar8].tax;
      cVar1 = o->lineorders[lVar8].commit_date[0];
      pcVar2 = pcVar7;
      while (cVar1 != '\0') {
        tdefs[5].vtotal = tdefs[5].vtotal + (long)cVar1;
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      }
      cVar1 = o->lineorders[lVar8].shipmode[0];
      pcVar2 = pcVar5;
      while (cVar1 != '\0') {
        tdefs[5].vtotal = tdefs[5].vtotal + (long)cVar1;
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      }
      lVar8 = lVar8 + 1;
      pcVar4 = pcVar4 + 0xa0;
      pcVar6 = pcVar6 + 0xa0;
      pcVar7 = pcVar7 + 0xa0;
      pcVar5 = pcVar5 + 0xa0;
    } while (lVar8 != o->lines);
  }
  return 0;
}

Assistant:

int
vrf_line(order_t *o, int mode)
{
    int i;

    UNUSED(mode);
    for (i = 0; i < o->lines; i++)
        {
	    VRF_STRT(LINE);
	    VRF_HUGE(LINE, o->lineorders[i].okey);
	    VRF_INT(LINE, o->lineorders[i].linenumber);
	    VRF_INT(LINE, o->lineorders[i].custkey);
	    VRF_INT(LINE, o->lineorders[i].partkey);
	    VRF_INT(LINE, o->lineorders[i].suppkey);
	    VRF_STR(LINE, o->lineorders[i].orderdate);
	    VRF_STR(LINE, o->lineorders[i].opriority);
	    VRF_INT(LINE, o->lineorders[i].ship_priority);
	    VRF_INT(LINE, o->lineorders[i].quantity);
	    VRF_INT(LINE, o->lineorders[i].extended_price);
	    VRF_INT(LINE, o->lineorders[i].order_totalprice);
	    VRF_INT(LINE, o->lineorders[i].discount);
	    VRF_INT(LINE, o->lineorders[i].revenue);
	    VRF_INT(LINE, o->lineorders[i].supp_cost);
	    VRF_INT(LINE, o->lineorders[i].tax);
	    VRF_STR(LINE, o->lineorders[i].commit_date);
	    VRF_STR(LINE, o->lineorders[i].shipmode);
	    VRF_END(LINE);
        }

    return(0);
}